

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcastu.c
# Opt level: O2

int buzzmu(monst *mtmp,attack *mattk)

{
  byte bVar1;
  byte bVar2;
  xchar sx;
  xchar sy;
  boolean bVar3;
  uint uVar4;
  int dx;
  int dy;
  char *pcVar5;
  
  if (10 < mattk->adtyp) {
    return 0;
  }
  if ((mtmp->field_0x61 & 1) != 0) {
    cursetxt(mtmp,'\0');
    return 0;
  }
  bVar3 = lined_up(mtmp);
  if (bVar3 == '\0') {
    return 1;
  }
  uVar4 = mt_random();
  if (uVar4 % 3 == 0) {
    return 1;
  }
  nomul(0,(char *)0x0);
  if (9 < (byte)(mattk->adtyp - 1)) {
    return 1;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001baf0f;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001baf06;
      }
      else {
LAB_001baf06:
        if (ublindf == (obj *)0x0) goto LAB_001bafec;
LAB_001baf0f:
        if (ublindf->oartifact != '\x1d') goto LAB_001bafec;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0)
          ) || ((mtmp->data->mflags3 & 0x200) == 0)) goto LAB_001bafec;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 == '\0') goto LAB_001bafec;
  }
  uVar4 = *(uint *)&mtmp->field_0x60;
  if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar4 & 0x280) != 0) goto LAB_001bafec;
  }
  else if (((uVar4 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_001bafec;
  if ((u._1052_1_ & 0x20) == 0) {
    pcVar5 = Monnam(mtmp);
    pline("%s zaps you with a %s!",pcVar5,flash_types[(ulong)mattk->adtyp + 9]);
  }
LAB_001bafec:
  bVar1 = mattk->adtyp;
  bVar2 = mattk->damn;
  sx = mtmp->mx;
  sy = mtmp->my;
  dx = sgn((int)tbx);
  dy = sgn((int)tby);
  buzz(-9 - (uint)bVar1,(uint)bVar2,sx,sy,dx,dy);
  return 1;
}

Assistant:

int buzzmu(struct monst *mtmp, const struct attack  *mattk)
{
	/* don't print constant stream of curse messages for 'normal'
	   spellcasting monsters at range */
	if (mattk->adtyp > AD_SPC2)
	    return 0;

	if (mtmp->mcan) {
	    cursetxt(mtmp, FALSE);
	    return 0;
	}
	if (lined_up(mtmp) && rn2(3)) {
	    nomul(0, NULL);
	    if (mattk->adtyp && (mattk->adtyp < 11)) { /* no cf unsigned >0 */
		if (canseemon(level, mtmp))
		    pline("%s zaps you with a %s!", Monnam(mtmp),
			  flash_types[ad_to_typ(mattk->adtyp)]);
		buzz(-ad_to_typ(mattk->adtyp), (int)mattk->damn,
		     mtmp->mx, mtmp->my, sgn(tbx), sgn(tby));
	    }
	}
	return 1;
}